

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3.cpp
# Opt level: O2

void __thiscall w3Interp::interp(w3Interp *this,w3Module *mod,w3Export *emain)

{
  pointer pwVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  w3ModuleInstance instance;
  
  if (((mod == (w3Module *)0x0) || (emain == (w3Export *)0x0)) ||
     (emain->tag != w3ImportTag_Function)) {
    AssertFailed("mod && emain && emain->tag == w3ExportTag_Function");
  }
  uVar4 = (ulong)(emain->field_4).function;
  pwVar1 = (mod->functions).super__Vector_base<w3Function,_std::allocator<w3Function>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = ((long)(mod->functions).super__Vector_base<w3Function,_std::allocator<w3Function>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)pwVar1) / 0x28;
  if (uVar2 <= uVar4) {
    AssertFailed("emain->function < mod->functions.size ()");
  }
  uVar3 = ((long)(mod->code).super__Vector_base<w3Code,_std::allocator<w3Code>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(mod->code).super__Vector_base<w3Code,_std::allocator<w3Code>_>._M_impl.
                super__Vector_impl_data._M_start) / 0x48;
  if (uVar4 < uVar3) {
    if (uVar2 == uVar3) {
      this->module = mod;
      w3ModuleInstance::w3ModuleInstance(&instance,mod);
      this->module_instance = &instance;
      Invoke(this,pwVar1 + uVar4);
      w3ModuleInstance::~w3ModuleInstance(&instance);
      return;
    }
    AssertFailed("mod->functions.size () == mod->code.size ()");
  }
  AssertFailed("emain->function < mod->code.size ()");
}

Assistant:

void interp (w3Module* mod, w3Export* emain = 0)
    {
        Assert (mod && emain && emain->tag == w3ExportTag_Function);
        Assert (emain->function < mod->functions.size ());
        Assert (emain->function < mod->code.size ());
        Assert (mod->functions.size () == mod->code.size ());

        w3Function& fmain = mod->functions [emain->function];
        //w3Code& cmain = mod->code [emain->function];

        // instantiate module
        this->module = mod;
        w3ModuleInstance instance (module);
        this->module_instance = &instance;

        // Simulate call to initial function.
        Invoke (fmain);
    }